

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::LogicalNotLayerParams::ByteSizeLong(LogicalNotLayerParams *this)

{
  int iVar1;
  int cached_size;
  size_t total_size;
  LogicalNotLayerParams *this_local;
  
  iVar1 = google::protobuf::internal::ToCachedSize(0);
  this->_cached_size_ = iVar1;
  return 0;
}

Assistant:

size_t LogicalNotLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LogicalNotLayerParams)
  size_t total_size = 0;

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}